

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O2

char * cinatra::detail::parse_http_version(char *buf,char *buf_end,int *minor_version,int *ret)

{
  if ((long)buf_end - (long)buf < 9) {
    *ret = -2;
  }
  else {
    if (((((*buf == 'H') && (buf[1] == 'T')) && (buf[2] == 'T')) &&
        ((buf[3] == 'P' && (buf[4] == '/')))) &&
       ((buf[5] == '1' && ((buf[6] == '.' && (0xf5 < (byte)(buf[7] - 0x3aU))))))) {
      *minor_version = (uint)(byte)(buf[7] - 0x30);
      return buf + 8;
    }
    *ret = -1;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_http_version(const char *buf, const char *buf_end,
                                      int *minor_version, int *ret) {
  /* we want at least [HTTP/1.<two chars>] to try to parse */
  if (buf_end - buf < 9) {
    *ret = -2;
    return NULL;
  }
  EXPECT_CHAR_NO_CHECK('H');
  EXPECT_CHAR_NO_CHECK('T');
  EXPECT_CHAR_NO_CHECK('T');
  EXPECT_CHAR_NO_CHECK('P');
  EXPECT_CHAR_NO_CHECK('/');
  EXPECT_CHAR_NO_CHECK('1');
  EXPECT_CHAR_NO_CHECK('.');
  PARSE_INT(minor_version, 1);
  return buf;
}